

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
MatchAndExplain(HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,StringView *s,MatchResultListener *listener)

{
  bool bVar1;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_38,s,&local_39);
  bVar1 = HasSubstrMatcher<std::__cxx11::string>::MatchAndExplain<std::__cxx11::string>
                    ((HasSubstrMatcher<std::__cxx11::string> *)this,&local_38,listener);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool MatchAndExplain(const internal::StringView& s,
                       MatchResultListener* listener) const {
    // This should fail to compile if StringView is used with wide
    // strings.
    const StringType& str = std::string(s);
    return MatchAndExplain(str, listener);
  }